

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.cpp
# Opt level: O2

U32 duckdb_zstd::ZSTD_litLengthPrice(U32 litLength,optState_t *optPtr,int optLevel)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  
  iVar2 = 0;
  uVar4 = (ulong)litLength;
  do {
    if (optPtr->priceType == zop_predef) {
      uVar3 = litLength + 1;
      iVar6 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      if (optLevel == 0) {
        iVar6 = iVar6 << 8;
        iVar2 = 0;
      }
      else {
        iVar6 = (uVar3 * 0x100 >> ((byte)iVar6 & 0x1f)) + iVar6 * 0x100;
        iVar2 = 0;
      }
LAB_01bd7ddc:
      return iVar2 + iVar6;
    }
    uVar3 = (uint)uVar4;
    if (uVar3 != 0x20000) {
      if (uVar3 < 0x40) {
        uVar3 = (uint)(byte)ZSTD_LLcode(unsigned_int)::LL_Code[uVar4];
      }
      else {
        uVar1 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
          }
        }
        uVar3 = (uVar1 ^ 0xffffffe0) + 0x33;
      }
      uVar5 = optPtr->litLengthFreq[uVar3] + 1;
      uVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      if (optLevel == 0) {
        iVar6 = (uVar1 ^ 0x1f) * 0x100 + -0x1f00;
      }
      else {
        iVar6 = -((uVar5 * 0x100 >> ((byte)uVar1 & 0x1f)) + uVar1 * 0x100);
      }
      iVar6 = (uint)(byte)LL_bits[uVar3] * 0x100 + optPtr->litLengthSumBasePrice + iVar6;
      goto LAB_01bd7ddc;
    }
    iVar2 = iVar2 + 0x100;
    uVar4 = 0x1ffff;
  } while( true );
}

Assistant:

static U32 ZSTD_litLengthPrice(U32 const litLength, const optState_t* const optPtr, int optLevel)
{
    assert(litLength <= ZSTD_BLOCKSIZE_MAX);
    if (optPtr->priceType == zop_predef)
        return WEIGHT(litLength, optLevel);

    /* ZSTD_LLcode() can't compute litLength price for sizes >= ZSTD_BLOCKSIZE_MAX
     * because it isn't representable in the zstd format.
     * So instead just pretend it would cost 1 bit more than ZSTD_BLOCKSIZE_MAX - 1.
     * In such a case, the block would be all literals.
     */
    if (litLength == ZSTD_BLOCKSIZE_MAX)
        return BITCOST_MULTIPLIER + ZSTD_litLengthPrice(ZSTD_BLOCKSIZE_MAX - 1, optPtr, optLevel);

    /* dynamic statistics */
    {   U32 const llCode = ZSTD_LLcode(litLength);
        return (LL_bits[llCode] * BITCOST_MULTIPLIER)
             + optPtr->litLengthSumBasePrice
             - WEIGHT(optPtr->litLengthFreq[llCode], optLevel);
    }
}